

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (; begin != end; begin = begin + uVar2) {
    uVar5 = (long)end - (long)begin;
    sVar3 = this->size_;
    uVar4 = this->capacity_;
    if (uVar4 < sVar3 + uVar5) {
      (*this->grow_)(this,sVar3 + uVar5);
      sVar3 = this->size_;
      uVar4 = this->capacity_;
    }
    uVar2 = uVar4 - sVar3;
    if (uVar5 <= uVar4 - sVar3) {
      uVar2 = uVar5;
    }
    pcVar1 = this->ptr_;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      pcVar1[uVar4 + sVar3] = begin[uVar4];
    }
    this->size_ = this->size_ + uVar2;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }